

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::resetPoolReleaseResourcesBitTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkResult result;
  VkDevice device;
  DeviceInterface *vk;
  allocator<char> local_79;
  string local_78;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_58;
  VkCommandPoolCreateInfo cmdPoolParams;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  cmdPoolParams.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  cmdPoolParams.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolParams.pNext = (void *)0x0;
  cmdPoolParams.flags = 0;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_78,vk,device,&cmdPoolParams,
             (VkAllocationCallbacks *)0x0);
  local_58.m_data.deleter.m_device = (VkDevice)local_78.field_2._M_allocated_capacity;
  local_58.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_78.field_2._8_8_;
  local_58.m_data.object.m_internal = (deUint64)local_78._M_dataplus._M_p;
  local_58.m_data.deleter.m_deviceIface = (DeviceInterface *)local_78._M_string_length;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_78.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_78);
  result = (*vk->_vptr_DeviceInterface[0x46])(vk,device,local_58.m_data.object.m_internal,1);
  ::vk::checkResult(result,
                    "vk.resetCommandPool(vkDevice, *cmdPool, VK_COMMAND_POOL_RESET_RELEASE_RESOURCES_BIT)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x237);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Command Pool allocated correctly.",&local_79);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_58);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus resetPoolReleaseResourcesBitTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		0u,															// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};

	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams, DE_NULL));

	VK_CHECK(vk.resetCommandPool(vkDevice, *cmdPool, VK_COMMAND_POOL_RESET_RELEASE_RESOURCES_BIT));

	return tcu::TestStatus::pass("Command Pool allocated correctly.");
}